

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O0

Solution *
lineage::heuristics::
applyInitializedHeuristic<lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
          (ProblemGraph *problemGraph,double costTermination,double costBirth,
          bool enforceBifurcationConstraint,string *solutionName,size_t maxDistance)

{
  bool bVar1;
  Problem *pPVar2;
  Data *in_RCX;
  byte in_DL;
  ProblemGraph *in_RSI;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  undefined8 in_R8;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  search;
  ofstream file_1;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> initializer;
  Solution init;
  Edge e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<lineage::Edge,_std::allocator<lineage::Edge>_> *__range2;
  Data data;
  ofstream file;
  Solution *solution;
  Solution *in_stack_fffffffffffff778;
  Timer *in_stack_fffffffffffff780;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *pGVar3;
  Data *in_stack_fffffffffffff788;
  iterator in_stack_fffffffffffff790;
  ProblemGraph *in_stack_fffffffffffff798;
  iterator in_stack_fffffffffffff7a0;
  const_iterator __position;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffff818;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffff868;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffff8a0;
  string local_678 [32];
  ostream local_658 [696];
  Solution *in_stack_fffffffffffffc60;
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffffc68;
  Data *in_stack_fffffffffffffc70;
  __normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
  local_2e8;
  vector<lineage::Edge,_std::allocator<lineage::Edge>_> *local_2e0;
  double local_2d0;
  double local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [96];
  undefined1 local_258 [544];
  undefined8 local_38;
  byte local_21;
  double local_20;
  double local_18;
  ProblemGraph *local_10;
  
  local_18 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_20 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_21 = in_DL & 1;
  pGVar3 = (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_258;
  __position._M_current = (double *)in_RDI;
  local_38 = in_R8;
  local_10 = in_RSI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                 (char *)in_stack_fffffffffffff7a0._M_current);
  std::ofstream::ofstream(local_258 + 0x20,(string *)pGVar3,_S_out);
  std::__cxx11::string::~string((string *)local_258);
  std::operator<<((ostream *)(local_258 + 0x20),
                  "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
                 );
  std::ofstream::close();
  std::ofstream::~ofstream(local_258 + 0x20);
  Data::Data((Data *)in_stack_fffffffffffff7a0._M_current,in_stack_fffffffffffff798);
  local_2c8 = local_20;
  local_2d0 = local_18;
  local_2b8[0x18] = local_21 & 1;
  std::__cxx11::string::operator=((string *)(local_2b8 + 0x20),(string *)in_RCX);
  local_2c0 = local_38;
  pPVar2 = ProblemGraph::problem(local_10);
  local_2e0 = &pPVar2->edges;
  local_2e8._M_current =
       (Edge *)std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::begin
                         ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)
                          in_stack_fffffffffffff778);
  std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::end
            ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)in_stack_fffffffffffff778);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                             *)in_stack_fffffffffffff780,
                            (__normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                             *)in_stack_fffffffffffff778), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
    ::operator*(&local_2e8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff790._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffff788);
    __gnu_cxx::
    __normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
    ::operator++(&local_2e8);
  }
  if (0.0 < local_18) {
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff778);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffff780,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffff778);
    ProblemGraph::graph(local_10);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x188034);
    in_stack_fffffffffffff7a0 =
         std::vector<double,_std::allocator<double>_>::insert
                   ((vector<double,_std::allocator<double>_> *)in_RDI,__position,(size_type)in_RCX,
                    in_stack_fffffffffffff7a0._M_current);
  }
  if (0.0 < local_20) {
    in_stack_fffffffffffff788 = (Data *)local_2b8;
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff778);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffff780,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffff778);
    ProblemGraph::graph(local_10);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1880bb);
    in_stack_fffffffffffff790 =
         std::vector<double,_std::allocator<double>_>::insert
                   ((vector<double,_std::allocator<double>_> *)in_RDI,__position,(size_type)in_RCX,
                    in_stack_fffffffffffff7a0._M_current);
  }
  Solution::Solution((Solution *)0x1880f9);
  levinkov::Timer::start(in_stack_fffffffffffff780);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  GreedyLineageAgglomeration(in_RDI,in_RCX);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::optimize(pGVar3);
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::getSolution
            (in_stack_fffffffffffff818);
  pGVar3 = (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)
           (local_658 + 0x200);
  Solution::operator=((Solution *)pGVar3,in_stack_fffffffffffff778);
  Solution::~Solution((Solution *)0x188169);
  levinkov::Timer::stop((Timer *)in_stack_fffffffffffff790._M_current);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  ~GreedyLineageAgglomeration(pGVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                 (char *)in_stack_fffffffffffff7a0._M_current);
  std::ofstream::ofstream(local_658,local_678,_S_out);
  std::__cxx11::string::~string(local_678);
  std::operator<<(local_658,
                  "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
                 );
  std::ofstream::close();
  std::ofstream::~ofstream(local_658);
  levinkov::Timer::start((Timer *)pGVar3);
  Solution::Solution((Solution *)pGVar3,in_stack_fffffffffffff778);
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::PartitionOptimizerBase
            ((LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)in_stack_fffffffffffff790._M_current,in_stack_fffffffffffff788,(Solution *)pGVar3);
  Solution::~Solution((Solution *)0x188241);
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::optimize(in_stack_fffffffffffff8a0);
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::getSolution(in_stack_fffffffffffff868);
  levinkov::Timer::stop((Timer *)in_stack_fffffffffffff790._M_current);
  postOptimizationChecks<lineage::Data,lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::Solution>
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::~LocalPartitionOptimizer
            ((LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)0x188395);
  Solution::~Solution((Solution *)0x1883a2);
  Data::~Data((Data *)pGVar3);
  return (Solution *)
         (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)
         __position._M_current;
}

Assistant:

Solution
applyInitializedHeuristic(
    ProblemGraph const& problemGraph, double costTermination = .0,
    double costBirth = .0, bool enforceBifurcationConstraint = false,
    std::string solutionName = "heuristic",
    size_t maxDistance = std::numeric_limits<size_t>::max())
{

    // create log file/replace existing log file with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    Data data(problemGraph);
    data.costBirth = costBirth;
    data.costTermination = costTermination;
    data.enforceBifurcationConstraint = enforceBifurcationConstraint;
    data.solutionName = solutionName;
    data.maxDistance = maxDistance;

    // define costs
    for (auto e : problemGraph.problem().edges)
        data.costs.push_back(e.weight);

    if (costTermination > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(),
                          costTermination);

    if (costBirth > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(), costBirth);

    Solution init;
    {
        data.timer.start();
        auto initializer = INITIALIZER(data);
        initializer.optimize();
        init = initializer.getSolution();
        data.timer.stop();
    }

    // create log replace log of initializer with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    data.timer.start();
    auto search = OPTIMIZER(data, init);

    search.optimize();
    const auto solution = search.getSolution();
    data.timer.stop();

    postOptimizationChecks(data, search, solution);

    return solution;
}